

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

CBString * visibleAsciiOrHex(CBString *__return_storage_ptr__,UINT8 *bytes,UINT32 length)

{
  UINT8 *pUVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  CBString *local_88;
  CBString hexString;
  CBString asciiString;
  CBString local_48;
  
  Bstrlib::CBString::CBString(&asciiString);
  Bstrlib::CBString::CBString(&hexString);
  bVar3 = true;
  uVar5 = 1;
  local_88 = &hexString;
  for (uVar6 = 0; uVar6 != length; uVar6 = uVar6 + 1) {
    usprintf(&local_48,"%02X",(ulong)bytes[uVar6]);
    Bstrlib::CBString::operator+=(&hexString,&local_48);
    Bstrlib::CBString::~CBString(&local_48);
    bVar2 = bytes[uVar6];
    uVar4 = uVar5;
    if ((bool)(bVar2 == 0 & uVar6 != 0 & bVar3)) {
      do {
        if (length <= uVar4) goto LAB_0013f6b2;
        pUVar1 = bytes + uVar4;
        uVar4 = uVar4 + 1;
      } while (*pUVar1 == '\0');
      bVar3 = false;
    }
    else {
      if ((byte)(bVar2 + 0x81) < 0xa1) {
        bVar3 = false;
      }
      if (bVar3) {
        usprintf(&local_48,"%c",(ulong)bVar2);
        Bstrlib::CBString::operator+=(&asciiString,&local_48);
        Bstrlib::CBString::~CBString(&local_48);
      }
    }
    uVar5 = uVar5 + 1;
  }
  if (bVar3) {
LAB_0013f6b2:
    local_88 = &asciiString;
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,local_88);
  Bstrlib::CBString::~CBString(&hexString);
  Bstrlib::CBString::~CBString(&asciiString);
  return __return_storage_ptr__;
}

Assistant:

UString visibleAsciiOrHex(UINT8* bytes, UINT32 length)
{
    bool ascii = true;
    UString asciiString;
    UString hexString;
    
    for (UINT32 i = 0; i < length; i++) {
        hexString += usprintf("%02X", bytes[i]);
        
        if (ascii && i > 0 && bytes[i] == '\x00') { // Check for the rest of the buffer being zeroes, and make the whole previous string visible, if so
            for (UINT32 j = i + 1; j < length; j++) {
                if (bytes[j] != '\x00') {
                    ascii = false;
                    break;
                }
            }
            
            if (ascii) {
                // No need to continue iterating over every symbol, we did it already
                break;
            }
        }
        else if (bytes[i] < '\x20' || bytes[i] > '\x7E') {  // Explicit ascii codes to avoid locale dependency
            ascii = false;
        }
        
        if (ascii) {
            asciiString += usprintf("%c", bytes[i]);
        }
    }
    
    if (ascii) {
        return asciiString;
    }
    
    return hexString;
}